

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O2

void forbody(LexState *ls,int base,int line,int nvars,int isnum)

{
  FuncState *fs;
  int list;
  int list_00;
  BlockCnt bl;
  
  fs = ls->fs;
  adjustlocalvars(ls,3);
  checknext(ls,0x103);
  if (isnum == 0) {
    list = luaK_jump(fs);
  }
  else {
    list = luaK_codeABx(fs,OP_FORPREP,base,0x1fffe);
  }
  bl.breaklist = -1;
  bl.isbreakable = '\0';
  bl.nactvar = fs->nactvar;
  bl.upval = '\0';
  bl.previous = fs->bl;
  fs->bl = &bl;
  adjustlocalvars(ls,nvars);
  luaK_reserveregs(fs,nvars);
  block(ls);
  leaveblock(fs);
  luaK_patchtohere(fs,list);
  if (isnum == 0) {
    list_00 = luaK_codeABC(fs,OP_TFORLOOP,base,0,nvars);
  }
  else {
    list_00 = luaK_codeABx(fs,OP_FORLOOP,base,0x1fffe);
  }
  luaK_fixline(fs,line);
  if (isnum == 0) {
    list_00 = luaK_jump(fs);
  }
  luaK_patchlist(fs,list_00,list + 1);
  return;
}

Assistant:

static void forbody (LexState *ls, int base, int line, int nvars, int isnum) {
  /* forbody -> DO block */
  BlockCnt bl;
  FuncState *fs = ls->fs;
  int prep, endfor;
  adjustlocalvars(ls, 3);  /* control variables */
  checknext(ls, TK_DO);
  prep = isnum ? luaK_codeAsBx(fs, OP_FORPREP, base, NO_JUMP) : luaK_jump(fs);
  enterblock(fs, &bl, 0);  /* scope for declared variables */
  adjustlocalvars(ls, nvars);
  luaK_reserveregs(fs, nvars);
  block(ls);
  leaveblock(fs);  /* end of scope for declared variables */
  luaK_patchtohere(fs, prep);
  endfor = (isnum) ? luaK_codeAsBx(fs, OP_FORLOOP, base, NO_JUMP) :
                     luaK_codeABC(fs, OP_TFORLOOP, base, 0, nvars);
  luaK_fixline(fs, line);  /* pretend that `OP_FOR' starts the loop */
  luaK_patchlist(fs, (isnum ? endfor : luaK_jump(fs)), prep + 1);
}